

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O3

void __thiscall
StunMsgCxx_RFC5769SampleRequest_Test::TestBody(StunMsgCxx_RFC5769SampleRequest_Test *this)

{
  long *plVar1;
  anon_unknown_dwarf_24028 aVar2;
  pointer msg_hdr;
  bool bVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  int iVar6;
  size_t sVar7;
  _stun_attr_varsize *p_Var8;
  stun_attr_uint32 *psVar9;
  stun_attr_uint64 *attr;
  stun_attr_msgint *msgint;
  stun_attr_hdr *psVar10;
  char *pcVar11;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  message message;
  char username [10];
  char password [23];
  char software_name [17];
  uint8_t tsx_id [12];
  u64 local_108;
  undefined1 local_f8 [32];
  varsize<char> local_d8;
  msgint local_b8;
  fingerprint local_a1;
  base_message<std::allocator<unsigned_char>_> local_a0;
  char local_88 [16];
  uint8_t local_78 [32];
  char local_58 [24];
  u32 local_40;
  uint8_t local_38 [16];
  
  builtin_strncpy(local_58,"STUN test client",0x11);
  builtin_strncpy(local_88,"evtj:h6vY",10);
  builtin_memcpy(local_78,"VOkJxbRl1RmTxUk/WvJxBt",0x17);
  local_38[0] = 0xb7;
  local_38[1] = 0xe7;
  local_38[2] = 0xa7;
  local_38[3] = '\x01';
  local_38[4] = 0xbc;
  local_38[5] = '4';
  local_38[6] = 0xd6;
  local_38[7] = 0x86;
  local_38[8] = 0xfa;
  local_38[9] = 0x87;
  local_38[10] = 0xdf;
  local_38[0xb] = 0xae;
  stun::base_message<std::allocator<unsigned_char>_>::base_message(&local_a0,1,local_38);
  sVar7 = strlen(local_58);
  local_f8._16_8_ = local_58 + sVar7;
  local_f8._0_2_ = 0x8022;
  local_f8[0x18] = ' ';
  local_f8._8_8_ = local_58;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&local_a0,(varsize<char> *)local_f8);
  local_40.type_ = 0x24;
  local_40._2_2_ = 0;
  local_40.value_ = 0x6e0001ff;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::u32>
            (&local_a0,&local_40);
  local_108.type_ = 0x8029;
  local_108.value_ = (uint64_t)&DAT_932ff9b151263b36;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::u64>
            (&local_a0,&local_108);
  sVar7 = strlen(local_88);
  local_d8.end_ = local_88 + sVar7;
  local_d8.type_ = 6;
  local_d8.pad_ = ' ';
  local_d8.begin_ = local_88;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&local_a0,&local_d8);
  local_b8.key_len_ = strlen(local_88 + 0x10);
  local_b8.key_ = (uint8_t *)(local_88 + 0x10);
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::msgint>
            (&local_a0,&local_b8);
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::fingerprint>
            (&local_a0,&local_a1);
  local_d8._0_8_ = &DAT_0000006c;
  local_108._0_8_ =
       stun_msg_len((stun_msg_hdr *)
                    local_a0.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_f8,"sizeof(expected_result)","message.size()",
             (unsigned_long *)&local_d8,(unsigned_long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((char *)local_f8._8_8_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x96,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00127e59;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  anon_unknown.dwarf_24028::IsEqual
            ((anon_unknown_dwarf_24028 *)&local_d8,&DAT_0014a330,
             local_a0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,0x6c);
  if (local_d8.type_._0_1_ == (anon_unknown_dwarf_24028)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_d8,
               (AssertionResult *)
               "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x98,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.begin_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_d8._0_4_ = 1;
  uVar4 = stun_msg_type((stun_msg_hdr *)
                        local_a0.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  local_108.type_ = uVar4;
  testing::internal::
  CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
            ((internal *)local_f8,"stun::message::binding_request","message.type()",
             (type *)&local_d8,&local_108.type_);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((char *)local_f8._8_8_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x9c,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  msg_hdr = local_a0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start;
  p_Var8 = (_stun_attr_varsize *)
           stun_msg_next_attr((stun_msg_hdr *)
                              local_a0.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,(stun_attr_hdr *)0x0);
  local_d8.type_._0_1_ = (anon_unknown_dwarf_24028)(p_Var8 != (_stun_attr_varsize *)0x0);
  local_d8.begin_ = (char *)0x0;
  if (p_Var8 == (_stun_attr_varsize *)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_d8,(AssertionResult *)"message.end() != i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x9f,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00127e59;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.begin_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_d8._0_4_ = 0x8022;
  uVar4 = stun_attr_type((stun_attr_hdr *)p_Var8);
  local_108.type_ = uVar4;
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_f8,"type::software","i->type()",(attribute_type *)&local_d8,
             &local_108.type_);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((char *)local_f8._8_8_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xa0,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108._0_8_ = msg_hdr;
  local_108.value_ = (uint64_t)p_Var8;
  stun::attribute::decoding_bits::string::to_string_abi_cxx11_
            ((string *)local_f8,(string *)&local_108);
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&local_d8,"software_name","i->to<type::software>().to_string()",
             (char (*) [17])local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  plVar1 = (long *)(local_f8 + 0x10);
  if ((long *)local_f8._0_8_ != plVar1) {
    operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
  }
  if (local_d8.type_._0_1_ == (anon_unknown_dwarf_24028)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_d8.begin_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_d8.begin_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xa2,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((long *)local_f8._0_8_ != (long *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)
        ) && ((long *)local_f8._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00127e59;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.begin_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  psVar9 = (stun_attr_uint32 *)stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)p_Var8);
  local_d8.type_._0_1_ = (anon_unknown_dwarf_24028)(psVar9 != (stun_attr_uint32 *)0x0);
  local_d8.begin_ = (char *)0x0;
  if (psVar9 == (stun_attr_uint32 *)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_d8,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xa4,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_f8._0_8_ != plVar1) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00127e59;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.begin_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_d8._0_4_ = 0x24;
  uVar4 = stun_attr_type((stun_attr_hdr *)psVar9);
  local_108.type_ = uVar4;
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_f8,"type::priority","i->type()",(attribute_type *)&local_d8,
             &local_108.type_);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((char *)local_f8._8_8_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xa5,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8._0_8_ = &DAT_6e0001ff;
  uVar5 = stun_attr_uint32_read(psVar9);
  local_108._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_f8,"0x6e0001fful","i->to<type::priority>().value()",
             (unsigned_long *)&local_d8,(uint *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((char *)local_f8._8_8_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xa7,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  attr = (stun_attr_uint64 *)stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)psVar9);
  local_d8.type_._0_1_ = (anon_unknown_dwarf_24028)(attr != (stun_attr_uint64 *)0x0);
  local_d8.begin_ = (char *)0x0;
  if (attr == (stun_attr_uint64 *)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_d8,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xa9,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_f8._0_8_ != plVar1) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00127e59;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.begin_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_d8._0_4_ = 0x8029;
  uVar4 = stun_attr_type((stun_attr_hdr *)attr);
  local_108.type_ = uVar4;
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_f8,"type::ice_controlled","i->type()",(attribute_type *)&local_d8,
             &local_108.type_);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((char *)local_f8._8_8_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xaa,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8._0_8_ = &DAT_932ff9b151263b36;
  local_108._0_8_ = stun_attr_uint64_read(attr);
  testing::internal::CmpHelperEQ<unsigned_long_long,unsigned_long>
            ((internal *)local_f8,"0x932ff9b151263b36ull","i->to<type::ice_controlled>().value()",
             (unsigned_long_long *)&local_d8,(unsigned_long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((char *)local_f8._8_8_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xac,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  p_Var8 = (_stun_attr_varsize *)stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)attr);
  local_d8.type_._0_1_ = (anon_unknown_dwarf_24028)(p_Var8 != (_stun_attr_varsize *)0x0);
  local_d8.begin_ = (char *)0x0;
  if (p_Var8 == (_stun_attr_varsize *)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_d8,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xae,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_f8._0_8_ != plVar1) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00127e59;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.begin_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_d8._0_4_ = 6;
  uVar4 = stun_attr_type((stun_attr_hdr *)p_Var8);
  local_108.type_ = uVar4;
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_f8,"type::username","i->type()",(attribute_type *)&local_d8,
             &local_108.type_);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((char *)local_f8._8_8_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xaf,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108._0_8_ = msg_hdr;
  local_108.value_ = (uint64_t)p_Var8;
  stun::attribute::decoding_bits::string::to_string_abi_cxx11_
            ((string *)local_f8,(string *)&local_108);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&local_d8,"username","i->to<type::username>().to_string()",
             (char (*) [10])local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  if ((long *)local_f8._0_8_ != plVar1) {
    operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
  }
  if (local_d8.type_._0_1_ == (anon_unknown_dwarf_24028)0x0) {
    testing::Message::Message((Message *)local_f8);
    if (local_d8.begin_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_d8.begin_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xb1,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((long *)local_f8._0_8_ != (long *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)
        ) && ((long *)local_f8._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.begin_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  msgint = (stun_attr_msgint *)stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)p_Var8);
  local_d8.type_._0_1_ = (anon_unknown_dwarf_24028)(msgint != (stun_attr_msgint *)0x0);
  local_d8.begin_ = (char *)0x0;
  if (msgint == (stun_attr_msgint *)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_d8,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xb3,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_f8._0_8_ != plVar1) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00127e59;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.begin_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_d8._0_4_ = 8;
  uVar4 = stun_attr_type((stun_attr_hdr *)msgint);
  local_108.type_ = uVar4;
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)local_f8,"type::message_integrity","i->type()",(attribute_type *)&local_d8,
             &local_108.type_);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((char *)local_f8._8_8_ == (char *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xb4,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f8._0_8_ = plVar1;
  sVar7 = strlen(local_88 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,local_88 + 0x10,local_88 + sVar7 + 0x10);
  iVar6 = stun_attr_msgint_check
                    (msgint,(stun_msg_hdr *)msg_hdr,(uint8_t *)local_f8._0_8_,local_f8._8_8_);
  local_d8.type_._0_1_ = (anon_unknown_dwarf_24028)(iVar6 != 0);
  local_d8.begin_ = (char *)0x0;
  if ((long *)local_f8._0_8_ == plVar1) {
    if (iVar6 == 0) goto LAB_00127b15;
  }
  else {
    operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    if ((local_d8._0_8_ & 1) == 0) {
LAB_00127b15:
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_f8,(internal *)&local_d8,
                 (AssertionResult *)"i->to<type::message_integrity>().check_integrity(password)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xb6,(char *)local_f8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if ((long *)local_f8._0_8_ != plVar1) {
        operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
      }
      if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d8.begin_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  psVar9 = (stun_attr_uint32 *)stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)msgint);
  local_d8.type_._0_1_ = (anon_unknown_dwarf_24028)(psVar9 != (stun_attr_uint32 *)0x0);
  local_d8.begin_ = (char *)0x0;
  if (psVar9 == (stun_attr_uint32 *)0x0) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_d8,(AssertionResult *)"message.end() != ++i",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0xb8,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_f8._0_8_ != plVar1) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_108._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_d8._0_4_ = 0x8028;
    uVar4 = stun_attr_type((stun_attr_hdr *)psVar9);
    local_108.type_ = uVar4;
    testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
              ((internal *)local_f8,"type::fingerprint","i->type()",(attribute_type *)&local_d8,
               &local_108.type_);
    if (local_f8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      if ((char *)local_f8._8_8_ == (char *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = *(char **)local_f8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xb9,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_d8._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    iVar6 = stun_attr_fingerprint_check(psVar9,(stun_msg_hdr *)msg_hdr);
    aVar2 = (anon_unknown_dwarf_24028)(iVar6 != 0);
    local_d8.begin_ = (char *)0x0;
    local_d8.type_._0_1_ = aVar2;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_f8,(internal *)&local_d8,
                 (AssertionResult *)"i->to<type::fingerprint>().check_integrity()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xbb,(char *)local_f8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if ((long *)local_f8._0_8_ != plVar1) {
        operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
      }
      if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         ((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    psVar10 = stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)psVar9);
    local_d8.type_._0_1_ = (anon_unknown_dwarf_24028)(psVar10 == (stun_attr_hdr *)0x0);
    local_d8.begin_ = (char *)0x0;
    if (psVar10 != (stun_attr_hdr *)0x0) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_f8,(internal *)&local_d8,(AssertionResult *)"message.end() == ++i",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0xbd,(char *)local_f8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if ((long *)local_f8._0_8_ != plVar1) {
        operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
      }
      if ((((AssertHelperData *)local_108._0_8_ != (AssertHelperData *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d8.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
LAB_00127e59:
  if ((stun_msg_hdr *)
      local_a0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (stun_msg_hdr *)0x0) {
    operator_delete(local_a0.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(StunMsgCxx, RFC5769SampleRequest) {
  const char software_name[] = "STUN test client";
  const char username[] = "evtj:h6vY";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x58, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x10, //    SOFTWARE attribute header
    0x53,0x54,0x55,0x4e, // }
    0x20,0x74,0x65,0x73, // }  User-agent...
    0x74,0x20,0x63,0x6c, // }  ...name
    0x69,0x65,0x6e,0x74, // }
    0x00,0x24,0x00,0x04, //    PRIORITY attribute header
    0x6e,0x00,0x01,0xff, //    ICE priority value
    0x80,0x29,0x00,0x08, //    ICE-CONTROLLED attribute header
    0x93,0x2f,0xf9,0xb1, // }  Pseudo-random tie breaker...
    0x51,0x26,0x3b,0x36, // }   ...for ICE control
    0x00,0x06,0x00,0x09, //    USERNAME attribute header
    0x65,0x76,0x74,0x6a, // }
    0x3a,0x68,0x36,0x76, // }  Username (9 bytes) and padding (3 bytes)
    0x59,0x20,0x20,0x20, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x9a,0xea,0xa7,0x0c, // }
    0xbf,0xd8,0xcb,0x56, // }
    0x78,0x1e,0xf2,0xb5, // }  HMAC-SHA1 fingerprint
    0xb2,0xd3,0xf2,0x49, // }
    0xc1,0xb5,0x71,0xa2, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xe5,0x7a,0x3b,0xcf, //    CRC0x32, fingerprint
  };

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  stun::message message(stun::message::binding_request, tsx_id);
  message << stun::attribute::software(software_name, ' ')
          << stun::attribute::priority(0x6e0001fful)
          << stun::attribute::ice_controlled(0x932ff9b151263b36ull)
          << stun::attribute::username(username, ' ')
          << stun::attribute::message_integrity(password)
          << stun::attribute::fingerprint();
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_request, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::software, i->type());
  ASSERT_EQ(software_name,
    i->to<type::software>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::priority, i->type());
  EXPECT_EQ(0x6e0001fful,
    i->to<type::priority>().value());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::ice_controlled, i->type());
  EXPECT_EQ(0x932ff9b151263b36ull,
    i->to<type::ice_controlled>().value());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::username, i->type());
  EXPECT_EQ(username,
    i->to<type::username>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(password));

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::fingerprint, i->type());
  EXPECT_TRUE(
    i->to<type::fingerprint>().check_integrity());

  ASSERT_TRUE(message.end() == ++i);
}